

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBT_correlation.cpp
# Opt level: O0

void __thiscall HBT_correlation::output_correlation_function(HBT_correlation *this)

{
  value_type vVar1;
  value_type vVar2;
  _Setw _Var3;
  _Setprecision _Var4;
  reference pvVar5;
  ostream *poVar6;
  reference pvVar7;
  char *pcVar8;
  void *pvVar9;
  long in_RDI;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double correl_fun_denorm;
  double correl_fun_num;
  double q_long_local;
  double q_side_local;
  double q_out_local;
  int npart_denorm;
  int npart_num;
  int iqside;
  int iqout;
  int iqlong;
  ofstream output;
  ostringstream filename;
  double npair_ratio;
  int iK;
  ostream *in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaf0;
  _Setprecision in_stack_fffffffffffffaf4;
  ParameterReader *in_stack_fffffffffffffaf8;
  allocator local_421;
  string local_420 [32];
  double local_400;
  double local_3f8;
  value_type local_3f0;
  value_type local_3e8;
  value_type local_3e0;
  int local_3d4;
  int local_3d0;
  int local_3cc;
  int local_3c8;
  int local_3c4;
  string local_3c0 [32];
  undefined1 local_3a0 [528];
  ostringstream local_190 [376];
  double local_18;
  int local_c;
  
  for (local_c = 0; local_c < *(int *)(in_RDI + 0x218) + -1; local_c = local_c + 1) {
    pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                        (in_RDI + 0x2e8),(long)local_c);
    vVar1 = *pvVar5;
    auVar11._8_4_ = (int)(vVar1 >> 0x20);
    auVar11._0_8_ = vVar1;
    auVar11._12_4_ = 0x45300000;
    pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                        (in_RDI + 0x300),(long)local_c);
    vVar2 = *pvVar5;
    auVar12._8_4_ = (int)(vVar2 >> 0x20);
    auVar12._0_8_ = vVar2;
    auVar12._12_4_ = 0x45300000;
    local_18 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)vVar1) - 4503599627370496.0)) /
               ((auVar12._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)vVar2) - 4503599627370496.0));
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar6 = std::operator<<((ostream *)local_190,(string *)(in_RDI + 0x30));
    poVar6 = std::operator<<(poVar6,"/HBT_correlation_function_KT_");
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x250),(long)local_c);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar7);
    poVar6 = std::operator<<(poVar6,"_");
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x250),
                        (long)(local_c + 1));
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar7);
    std::operator<<(poVar6,".dat");
    std::__cxx11::ostringstream::str();
    pcVar8 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(local_3a0,pcVar8,_S_out);
    std::__cxx11::string::~string(local_3c0);
    for (local_3c4 = 0; local_3c4 < *(int *)(in_RDI + 0x1ec); local_3c4 = local_3c4 + 1) {
      for (local_3c8 = 0; local_3c8 < *(int *)(in_RDI + 0x1ec); local_3c8 = local_3c8 + 1) {
        for (local_3cc = 0; local_3cc < *(int *)(in_RDI + 0x1ec); local_3cc = local_3cc + 1) {
          local_3d0 = (int)*(double *)
                            (*(long *)(*(long *)(*(long *)(*(long *)(in_RDI + 0x3a0) +
                                                          (long)local_c * 8) + (long)local_3c8 * 8)
                                      + (long)local_3cc * 8) + (long)local_3c4 * 8);
          local_3d4 = (int)*(double *)
                            (*(long *)(*(long *)(*(long *)(*(long *)(in_RDI + 0x398) +
                                                          (long)local_c * 8) + (long)local_3c8 * 8)
                                      + (long)local_3cc * 8) + (long)local_3c4 * 8);
          if ((local_3d0 < 2) || (local_3d4 < 2)) {
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x280),
                                (long)local_3c8);
            local_3e0 = *pvVar7;
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x298),
                                (long)local_3cc);
            local_3e8 = *pvVar7;
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2b0),
                                (long)local_3c4);
            local_3f0 = *pvVar7;
            local_3f8 = 0.0;
            local_400 = (double)local_3d4;
          }
          else {
            local_3e0 = *(double *)
                         (*(long *)(*(long *)(*(long *)(*(long *)(in_RDI + 0x378) +
                                                       (long)local_c * 8) + (long)local_3c8 * 8) +
                                   (long)local_3cc * 8) + (long)local_3c4 * 8) / (double)local_3d0;
            local_3e8 = *(double *)
                         (*(long *)(*(long *)(*(long *)(*(long *)(in_RDI + 0x380) +
                                                       (long)local_c * 8) + (long)local_3c8 * 8) +
                                   (long)local_3cc * 8) + (long)local_3c4 * 8) / (double)local_3d0;
            local_3f0 = *(double *)
                         (*(long *)(*(long *)(*(long *)(*(long *)(in_RDI + 0x388) +
                                                       (long)local_c * 8) + (long)local_3c8 * 8) +
                                   (long)local_3cc * 8) + (long)local_3c4 * 8) / (double)local_3d0;
            local_3f8 = *(double *)
                         (*(long *)(*(long *)(*(long *)(*(long *)(in_RDI + 0x390) +
                                                       (long)local_c * 8) + (long)local_3c8 * 8) +
                                   (long)local_3cc * 8) + (long)local_3c4 * 8);
            local_400 = local_18 *
                        *(double *)
                         (*(long *)(*(long *)(*(long *)(*(long *)(in_RDI + 0x398) +
                                                       (long)local_c * 8) + (long)local_3c8 * 8) +
                                   (long)local_3cc * 8) + (long)local_3c4 * 8);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_420,"ecoOutput",&local_421);
          dVar10 = ParameterReader::getVal
                             (in_stack_fffffffffffffaf8,
                              (string *)
                              CONCAT44(in_stack_fffffffffffffaf4._M_n,in_stack_fffffffffffffaf0),
                              (double)in_stack_fffffffffffffae8);
          std::__cxx11::string::~string(local_420);
          std::allocator<char>::~allocator((allocator<char> *)&local_421);
          if ((dVar10 != 1.0) || (NAN(dVar10))) {
            poVar6 = (ostream *)std::ostream::operator<<(local_3a0,std::scientific);
            _Var3 = std::setw(0x12);
            in_stack_fffffffffffffaf8 = (ParameterReader *)std::operator<<(poVar6,_Var3);
            in_stack_fffffffffffffaf4 = std::setprecision(8);
            in_stack_fffffffffffffae8 =
                 std::operator<<((ostream *)in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf4);
            poVar6 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffae8,local_3e0);
            poVar6 = std::operator<<(poVar6,"    ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_3e8);
            poVar6 = std::operator<<(poVar6,"    ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_3f0);
            poVar6 = std::operator<<(poVar6,"    ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_3f8);
            poVar6 = std::operator<<(poVar6,"    ");
            pvVar9 = (void *)std::ostream::operator<<(poVar6,local_400);
            std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
          }
          else {
            poVar6 = (ostream *)std::ostream::operator<<(local_3a0,std::scientific);
            _Var3 = std::setw(0x12);
            poVar6 = std::operator<<(poVar6,_Var3);
            _Var4 = std::setprecision(8);
            poVar6 = std::operator<<(poVar6,_Var4);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_3f8);
            poVar6 = std::operator<<(poVar6,"    ");
            pvVar9 = (void *)std::ostream::operator<<(poVar6,local_400);
            std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
          }
        }
      }
    }
    std::ofstream::close();
    std::ofstream::~ofstream(local_3a0);
    std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  return;
}

Assistant:

void HBT_correlation::output_correlation_function() {
    for (int iK = 0; iK < n_KT - 1; iK++) {
        double npair_ratio =
            (static_cast<double>(number_of_pairs_numerator_KTdiff[iK])
             / static_cast<double>(number_of_pairs_denormenator_KTdiff[iK]));
        std::ostringstream filename;
        filename << path_ << "/HBT_correlation_function_KT_" << KT_array_[iK]
                 << "_" << KT_array_[iK + 1] << ".dat";
        std::ofstream output(filename.str().c_str());
        for (int iqlong = 0; iqlong < qnpts; iqlong++) {
            for (int iqout = 0; iqout < qnpts; iqout++) {
                for (int iqside = 0; iqside < qnpts; iqside++) {
                    int npart_num =
                        correl_3d_num_count[iK][iqout][iqside][iqlong];
                    int npart_denorm =
                        correl_3d_denorm[iK][iqout][iqside][iqlong];
                    double q_out_local, q_side_local, q_long_local;
                    double correl_fun_num, correl_fun_denorm;
                    if (npart_num < 2 || npart_denorm < 2) {
                        q_out_local = q_out[iqout];
                        q_side_local = q_side[iqside];
                        q_long_local = q_long[iqlong];
                        correl_fun_num = 0.0;
                        correl_fun_denorm = npart_denorm;
                    } else {
                        q_out_local =
                            (q_out_mean[iK][iqout][iqside][iqlong] / npart_num);
                        q_side_local =
                            (q_side_mean[iK][iqout][iqside][iqlong]
                             / npart_num);
                        q_long_local =
                            (q_long_mean[iK][iqout][iqside][iqlong]
                             / npart_num);

                        correl_fun_num =
                            (correl_3d_num[iK][iqout][iqside][iqlong]);
                        correl_fun_denorm =
                            (npair_ratio
                             * correl_3d_denorm[iK][iqout][iqside][iqlong]);
                    }

                    if (paraRdr_.getVal("ecoOutput", 0) == 1) {
                        output << std::scientific << std::setw(18)
                               << std::setprecision(8) << correl_fun_num
                               << "    " << correl_fun_denorm << std::endl;
                    } else {
                        output << std::scientific << std::setw(18)
                               << std::setprecision(8) << q_out_local << "    "
                               << q_side_local << "    " << q_long_local
                               << "    " << correl_fun_num << "    "
                               << correl_fun_denorm << std::endl;
                    }
                }
            }
        }
        output.close();
    }
}